

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketsOps.cpp
# Opt level: O1

bool sznet::net::sockets::sz_sock_isselfconnect(sz_sock sockfd)

{
  undefined1 local_50 [8];
  sockaddr_in6 localaddr;
  sockaddr_in6 peeraddr;
  
  sz_sock_getlocaladdr((sockaddr_in6 *)local_50,sockfd);
  sz_sock_getpeeraddr((sockaddr_in6 *)((long)&localaddr.sin6_addr.__in6_u + 0xc),sockfd);
  if (local_50._0_2_ == 10) {
    if (local_50._2_2_ == localaddr.sin6_addr.__in6_u.__u6_addr16[7]) {
      return localaddr._0_16_ == peeraddr._0_16_;
    }
  }
  else if (local_50._0_2_ == 2) {
    return local_50._4_4_ == localaddr.sin6_scope_id &&
           local_50._2_2_ == localaddr.sin6_addr.__in6_u.__u6_addr16[7];
  }
  return false;
}

Assistant:

bool sz_sock_isselfconnect(sz_sock sockfd)
{
	struct sockaddr_in6 localaddr = sz_sock_getlocaladdr(sockfd);
	struct sockaddr_in6 peeraddr = sz_sock_getpeeraddr(sockfd);
	if (localaddr.sin6_family == AF_INET)
	{
		const struct sockaddr_in* laddr4 = reinterpret_cast<struct sockaddr_in*>(&localaddr);
		const struct sockaddr_in* raddr4 = reinterpret_cast<struct sockaddr_in*>(&peeraddr);
		return laddr4->sin_port == raddr4->sin_port
			&& laddr4->sin_addr.s_addr == raddr4->sin_addr.s_addr;
	}
	else if (localaddr.sin6_family == AF_INET6)
	{
		return localaddr.sin6_port == peeraddr.sin6_port
			&& memcmp(&localaddr.sin6_addr, &peeraddr.sin6_addr, sizeof(localaddr.sin6_addr)) == 0;
	}
	else
	{
		return false;
	}
}